

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O3

void __thiscall
fmt::v5::vprint<char[11],char>
          (v5 *this,FILE *f,text_style *ts,char (*format) [11],
          basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          args)

{
  FILE FVar1;
  ulong uVar2;
  int i;
  long lVar3;
  byte *pbVar4;
  size_t sVar5;
  long lVar6;
  uint uVar7;
  byte bVar8;
  char cVar9;
  char cVar10;
  uint uVar11;
  bool bVar12;
  bool bVar13;
  string_view format_str;
  string_view format_str_00;
  format_args args_00;
  format_args args_01;
  undefined4 local_48;
  byte local_44 [20];
  
  args_00.
  super_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  .field_1 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_2
              )args.types_;
  FVar1 = f[0x12];
  bVar12 = FVar1 != (FILE)0x0;
  if (bVar12) {
    local_48 = 0;
    bVar13 = ((byte)FVar1 & 1) != 0;
    if (bVar13) {
      local_48 = 1;
    }
    local_48 = (uint)bVar13;
    if (((byte)FVar1 & 2) != 0) {
      local_48._0_2_ = CONCAT11(3,bVar13);
      local_48 = (uint)(ushort)local_48;
    }
    if (((byte)FVar1 & 4) != 0) {
      local_48._0_3_ = CONCAT12(4,(ushort)local_48);
      local_48 = (uint)(uint3)local_48;
    }
    if (((byte)FVar1 & 8) != 0) {
      local_48 = CONCAT13(9,(uint3)local_48);
    }
    lVar3 = 0;
    lVar6 = 0;
    do {
      cVar10 = *(char *)((long)&local_48 + lVar3);
      if (cVar10 != '\0') {
        (local_44 + lVar6)[0] = 0x1b;
        (local_44 + lVar6)[1] = 0x5b;
        local_44[lVar6 + 2] = cVar10 + 0x30;
        local_44[lVar6 + 3] = 0x6d;
        lVar6 = lVar6 + 4;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    local_44[lVar6] = 0;
    fputs((char *)local_44,(FILE *)this);
  }
  if (f[0x10] == (FILE)0x1) {
    uVar2 = *(ulong *)f;
    cVar10 = (char)(uVar2 >> 0x20);
    uVar7 = (uint)(uVar2 >> 0x20);
    if ((uVar2 & 1) == 0) {
      uVar11 = uVar7 & 0xff;
      lVar3 = 2;
      if (99 < uVar11) {
        local_44[2] = 0x31;
        uVar11 = (uint)(byte)(cVar10 + (char)((uVar7 & 0xff) * 0x29 >> 0xc) * -100);
        lVar3 = 3;
      }
      bVar8 = (byte)(uVar11 / 10);
      pbVar4 = local_44 + lVar3 + 3;
      local_44[lVar3] = bVar8 | 0x30;
      local_44[lVar3 + 1] = (char)uVar11 + bVar8 * -10 | 0x30;
    }
    else {
      pbVar4 = local_44 + 0x13;
      local_44[2] = 0x33;
      local_44[3] = 0x38;
      local_44[4] = 0x3b;
      local_44[5] = 0x32;
      local_44[6] = 0x3b;
      uVar11 = (ushort)(uVar2 >> 0x30) & 0xff;
      local_44[7] = (byte)(uVar11 * 0x29 >> 0xc) | 0x30;
      uVar11 = uVar11 / 10;
      cVar9 = (char)uVar11;
      local_44[8] = cVar9 + ((byte)(uVar11 / 5) & 6) * -5 | 0x30;
      local_44[9] = (char)(uVar2 >> 0x30) + cVar9 * -10 | 0x30;
      local_44[10] = 0x3b;
      uVar11 = uVar7 >> 8 & 0xff;
      local_44[0xb] = (byte)(uVar11 * 0x29 >> 0xc) | 0x30;
      uVar11 = uVar11 / 10;
      cVar9 = (char)uVar11;
      local_44[0xc] = cVar9 + ((byte)(uVar11 / 5) & 6) * -5 | 0x30;
      local_44[0xd] = (char)(uVar2 >> 0x28) + cVar9 * -10 | 0x30;
      local_44[0xe] = 0x3b;
      local_44[0xf] = (byte)((uVar7 & 0xff) * 0x29 >> 0xc) | 0x30;
      uVar7 = (uVar7 & 0xff) / 10;
      cVar9 = (char)uVar7;
      local_44[0x10] = cVar9 + ((byte)(uVar7 / 5) & 6) * -5 | 0x30;
      local_44[0x11] = cVar10 + cVar9 * -10 | 0x30;
    }
    local_44[0] = 0x1b;
    local_44[1] = 0x5b;
    pbVar4[-1] = 0x6d;
    *pbVar4 = 0;
    fputs((char *)local_44,(FILE *)this);
    bVar12 = true;
  }
  if (f[0x11] == (FILE)0x1) {
    uVar2 = *(ulong *)(f + 8);
    uVar7 = (uint)(uVar2 >> 0x20);
    if ((uVar2 & 1) == 0) {
      uVar11 = (uVar7 & 0xff) + 10;
      lVar3 = 2;
      if (0x59 < (uVar7 & 0xff)) {
        local_44[2] = 0x31;
        uVar11 = uVar11 % 100;
        lVar3 = 3;
      }
      bVar8 = (byte)((uVar11 & 0xff) / 10);
      pbVar4 = local_44 + lVar3 + 3;
      local_44[lVar3] = bVar8 | 0x30;
      local_44[lVar3 + 1] = (char)uVar11 + bVar8 * -10 | 0x30;
    }
    else {
      pbVar4 = local_44 + 0x13;
      local_44[2] = 0x34;
      local_44[3] = 0x38;
      local_44[4] = 0x3b;
      local_44[5] = 0x32;
      local_44[6] = 0x3b;
      uVar11 = (ushort)(uVar2 >> 0x30) & 0xff;
      local_44[7] = (byte)(uVar11 * 0x29 >> 0xc) | 0x30;
      uVar11 = uVar11 / 10;
      cVar10 = (char)uVar11;
      local_44[8] = cVar10 + ((byte)(uVar11 / 5) & 6) * -5 | 0x30;
      local_44[9] = (char)(uVar2 >> 0x30) + cVar10 * -10 | 0x30;
      local_44[10] = 0x3b;
      uVar11 = uVar7 >> 8 & 0xff;
      local_44[0xb] = (byte)(uVar11 * 0x29 >> 0xc) | 0x30;
      uVar11 = uVar11 / 10;
      cVar10 = (char)uVar11;
      local_44[0xc] = cVar10 + ((byte)(uVar11 / 5) & 6) * -5 | 0x30;
      local_44[0xd] = (char)(uVar2 >> 0x28) + cVar10 * -10 | 0x30;
      local_44[0xe] = 0x3b;
      local_44[0xf] = (byte)((uVar7 & 0xff) * 0x29 >> 0xc) | 0x30;
      uVar7 = (uVar7 & 0xff) / 10;
      cVar10 = (char)uVar7;
      local_44[0x10] = cVar10 + ((byte)(uVar7 / 5) & 6) * -5 | 0x30;
      local_44[0x11] = (char)(uVar2 >> 0x20) + cVar10 * -10 | 0x30;
    }
    local_44[0] = 0x1b;
    local_44[1] = 0x5b;
    pbVar4[-1] = 0x6d;
    *pbVar4 = 0;
    fputs((char *)local_44,(FILE *)this);
    sVar5 = strlen((char *)ts);
    format_str_00.size_ = sVar5;
    format_str_00.data_ = (char *)ts;
    args_01.
    super_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
    .field_1.values_ =
         args_00.
         super_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
         .field_1.values_;
    args_01.
    super_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
    .types_ = (unsigned_long_long)format;
    vprint((FILE *)this,format_str_00,args_01);
  }
  else {
    sVar5 = strlen((char *)ts);
    format_str.size_ = sVar5;
    format_str.data_ = (char *)ts;
    args_00.
    super_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
    .types_ = (unsigned_long_long)format;
    vprint((FILE *)this,format_str,args_00);
    if (!bVar12) {
      return;
    }
  }
  fputs("\x1b[0m",(FILE *)this);
  return;
}

Assistant:

void vprint(std::FILE *f, const text_style &ts, const S &format,
            basic_format_args<typename buffer_context<Char>::type> args) {
  bool has_style = false;
  if (ts.has_emphasis()) {
    has_style = true;
    internal::fputs<Char>(
          internal::make_emphasis<Char>(ts.get_emphasis()), f);
  }
  if (ts.has_foreground()) {
    has_style = true;
    internal::fputs<Char>(
          internal::make_foreground_color<Char>(ts.get_foreground()), f);
  }
  if (ts.has_background()) {
    has_style = true;
    internal::fputs<Char>(
        internal::make_background_color<Char>(ts.get_background()), f);
  }
  vprint(f, format, args);
  if (has_style) {
    internal::reset_color<Char>(f);
  }
}